

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O3

int getopt_read_value(getopt_context_t *ctx,getopt_option_t *found_opt)

{
  int iVar1;
  long lVar2;
  float fVar3;
  char *end;
  char *local_18;
  
  local_18 = (char *)0x0;
  if (found_opt->type - GETOPT_OPTION_TYPE_REQUIRED_FP32 < 2) {
    fVar3 = strtof(ctx->current_opt_arg,&local_18);
    (ctx->current_value).fp32 = fVar3;
  }
  else if (found_opt->type - GETOPT_OPTION_TYPE_REQUIRED_INT32 < 2) {
    lVar2 = strtol(ctx->current_opt_arg,&local_18,0);
    (ctx->current_value).i32 = (int)lVar2;
  }
  if (*local_18 == '\0') {
    iVar1 = found_opt->value;
  }
  else {
    ctx->current_opt_arg = found_opt->name;
    iVar1 = 0x21;
  }
  return iVar1;
}

Assistant:

static int getopt_read_value(getopt_context_t* ctx, const getopt_option_t* found_opt)
{
	char* end = 0x0;
	switch(found_opt->type)
	{
		case GETOPT_OPTION_TYPE_OPTIONAL_INT32:
		case GETOPT_OPTION_TYPE_REQUIRED_INT32:
			ctx->current_value.i32 = (int)strtol(ctx->current_opt_arg, &end, 0);
			break;
		case GETOPT_OPTION_TYPE_OPTIONAL_FP32:
		case GETOPT_OPTION_TYPE_REQUIRED_FP32:
			ctx->current_value.fp32 = strtof(ctx->current_opt_arg, &end);
			break;
		default:
			break;
	}

	if(*end != '\0')
	{
		ctx->current_opt_arg = found_opt->name;
		return '!';
	}
	return found_opt->value;
}